

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QRhiColorAttachment>::append_impl
          (QVLABase<QRhiColorAttachment> *this,qsizetype prealloc,void *array,
          QRhiColorAttachment *abuf,qsizetype increment)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long asize;
  long lVar10;
  
  if (0 < increment) {
    asize = (this->super_QVLABaseBase).s;
    lVar1 = asize + increment;
    if ((this->super_QVLABaseBase).a <= lVar1) {
      lVar10 = asize * 2;
      if (asize * 2 <= lVar1) {
        lVar10 = lVar1;
      }
      reallocate_impl(this,prealloc,array,asize,lVar10);
      asize = (this->super_QVLABaseBase).s;
    }
    pvVar4 = (this->super_QVLABaseBase).ptr;
    lVar10 = 0;
    do {
      puVar3 = (undefined8 *)((long)&abuf->m_texture + lVar10);
      uVar5 = *puVar3;
      uVar6 = puVar3[1];
      puVar3 = (undefined8 *)((long)&abuf->m_layer + lVar10);
      uVar7 = *puVar3;
      uVar8 = puVar3[1];
      puVar3 = (undefined8 *)((long)&abuf->m_resolveLayer + lVar10);
      uVar9 = puVar3[1];
      puVar2 = (undefined8 *)((long)pvVar4 + lVar10 + asize * 0x30 + 0x20);
      *puVar2 = *puVar3;
      puVar2[1] = uVar9;
      puVar3 = (undefined8 *)((long)pvVar4 + lVar10 + asize * 0x30 + 0x10);
      *puVar3 = uVar7;
      puVar3[1] = uVar8;
      puVar3 = (undefined8 *)((long)pvVar4 + lVar10 + asize * 0x30);
      *puVar3 = uVar5;
      puVar3[1] = uVar6;
      lVar10 = lVar10 + 0x30;
    } while (increment * 0x30 != lVar10);
    (this->super_QVLABaseBase).s = lVar1;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::append_impl(qsizetype prealloc, void *array, const T *abuf, qsizetype increment)
{
    Q_ASSERT(abuf || increment == 0);
    if (increment <= 0)
        return;

    const qsizetype asize = size() + increment;

    if (asize >= capacity())
        growBy(prealloc, array, increment);

    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_copy_n(abuf, increment, end());
    else
        memcpy(static_cast<void *>(end()), static_cast<const void *>(abuf), increment * sizeof(T));

    this->s = asize;
}